

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O0

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::prepare_pong
          (hybi13<websocketpp::config::asio> *this,string *in,message_ptr *out)

{
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  *in_RDX;
  error_code eVar1;
  message_ptr *in_stack_00000088;
  string *in_stack_00000090;
  value in_stack_0000009c;
  hybi13<websocketpp::config::asio> *in_stack_000000a0;
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  *in_stack_ffffffffffffff88;
  
  std::
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::shared_ptr(in_RDX,in_stack_ffffffffffffff88);
  eVar1 = prepare_control(in_stack_000000a0,in_stack_0000009c,in_stack_00000090,in_stack_00000088);
  std::
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                 *)0x32f1e3);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

lib::error_code prepare_pong(std::string const & in, message_ptr out) const {
        return this->prepare_control(frame::opcode::PONG,in,out);
    }